

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

void QApplicationPrivate::setSystemFont(QFont *font)

{
  QFont *this;
  QFont *in_RDI;
  char *in_stack_00000020;
  QFont *in_stack_00000028;
  
  if (sys_font == (QFont *)0x0) {
    this = (QFont *)operator_new(0x10);
    QFont::QFont(this,in_RDI);
    sys_font = this;
  }
  else {
    QFont::operator=(sys_font,in_RDI);
  }
  if (set_font == (QFont *)0x0) {
    QApplication::setFont(in_stack_00000028,in_stack_00000020);
  }
  return;
}

Assistant:

void QApplicationPrivate::setSystemFont(const QFont &font)
{
     if (!sys_font)
        sys_font = new QFont(font);
    else
        *sys_font = font;

    if (!QApplicationPrivate::set_font)
        QApplication::setFont(*sys_font);
}